

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O3

bool __thiscall llvm::APInt::EqualSlowCase(APInt *this,APInt *RHS)

{
  int iVar1;
  
  if ((ulong)this->BitWidth != 0) {
    iVar1 = bcmp((this->U).pVal,(RHS->U).pVal,
                 (ulong)((uint)((ulong)this->BitWidth + 0x3f >> 3) & 0xfffffff8));
    return iVar1 == 0;
  }
  return true;
}

Assistant:

unsigned getNumWords() const { return getNumWords(BitWidth); }